

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-util.c++
# Opt level: O1

void capnp::_::initTestMessage(Builder builder)

{
  byte *pbVar1;
  undefined1 *puVar2;
  PointerBuilder builder_00;
  PointerBuilder builder_01;
  PointerBuilder builder_02;
  PointerBuilder builder_03;
  PointerBuilder builder_04;
  PointerBuilder builder_05;
  CapTableBuilder *pCVar3;
  byte *b;
  long lVar4;
  ulong uVar5;
  Reader value;
  Reader value_00;
  Reader value_01;
  Reader value_02;
  Reader value_03;
  Reader value_04;
  Reader value_05;
  Reader value_06;
  Reader value_07;
  Reader value_08;
  Reader value_09;
  Reader value_10;
  ArrayPtr<const_bool> value_11;
  ArrayPtr<const_capnp::Text::Reader> value_12;
  ArrayPtr<const_capnp::Data::Reader> value_13;
  ArrayPtr<const_bool> value_14;
  ArrayPtr<const_capnp::Text::Reader> value_15;
  ArrayPtr<const_capnp::Data::Reader> value_16;
  SegmentBuilder *in_stack_00000008;
  CapTableBuilder *in_stack_00000010;
  Builder subBuilder;
  Builder subSubBuilder;
  StructBuilder local_e0;
  StructBuilder local_b8;
  undefined1 local_90 [24];
  undefined8 local_78;
  char *local_70;
  undefined8 local_68;
  PointerBuilder local_60;
  CapTableBuilder *local_48;
  SegmentBuilder *local_40;
  SegmentBuilder *local_38;
  
  *(byte *)&((subBuilder._builder.segment)->super_SegmentReader).arena =
       *(byte *)&((subBuilder._builder.segment)->super_SegmentReader).arena & 0xfe;
  (subBuilder._builder.segment)->pos = (word *)0x0;
  *(undefined8 *)((long)&((subBuilder._builder.segment)->super_SegmentReader).arena + 1) = 0;
  *(undefined8 *)((long)&((subBuilder._builder.segment)->super_SegmentReader).id.value + 1) = 0;
  *(undefined8 *)((long)&((subBuilder._builder.segment)->super_SegmentReader).ptr.ptr + 2) = 0;
  *(undefined8 *)((long)&((subBuilder._builder.segment)->super_SegmentReader).ptr.size_ + 2) = 0;
  local_40 = subBuilder._builder.segment;
  *(undefined2 *)((long)&((subBuilder._builder.segment)->super_SegmentReader).readLimiter + 2) = 0;
  value.super_StringPtr.content.size_ = 4;
  value.super_StringPtr.content.ptr = "foo";
  PointerBuilder::setBlob<capnp::Text>((PointerBuilder *)local_90,value);
  local_90._16_8_ = subBuilder._builder.capTable + 1;
  value_00.super_ArrayPtr<const_unsigned_char>.size_ = 3;
  value_00.super_ArrayPtr<const_unsigned_char>.ptr = "bar";
  PointerBuilder::setBlob<capnp::Data>((PointerBuilder *)local_90,value_00);
  local_90._16_8_ = subBuilder._builder.capTable + 2;
  local_38 = in_stack_00000008;
  local_48 = in_stack_00000010;
  PointerBuilder::initStruct(&local_e0,(PointerBuilder *)local_90,(StructSize)0x140006);
  *(byte *)local_e0.data = *local_e0.data | 1;
  *(byte *)((long)local_e0.data + 1) = 0xf4;
  ((byte *)((long)local_e0.data + 2))[0] = 0x80;
  ((byte *)((long)local_e0.data + 2))[1] = 0xd;
  pbVar1 = (byte *)((long)local_e0.data + 4);
  pbVar1[0] = 0xe;
  pbVar1[1] = 0x10;
  pbVar1[2] = 0x4c;
  pbVar1[3] = 0xfb;
  pbVar1 = (byte *)((long)local_e0.data + 8);
  pbVar1[0] = 0x4e;
  pbVar1[1] = 0x73;
  pbVar1[2] = 0xe8;
  pbVar1[3] = 0x38;
  pbVar1[4] = 0xa6;
  pbVar1[5] = 0x33;
  pbVar1[6] = 0;
  pbVar1[7] = 0;
  *(byte *)((long)local_e0.data + 0x10) = 0x5a;
  ((byte *)((long)local_e0.data + 0x12))[0] = 0xd2;
  ((byte *)((long)local_e0.data + 0x12))[1] = 4;
  pbVar1 = (byte *)((long)local_e0.data + 0x14);
  pbVar1[0] = 0x14;
  pbVar1[1] = 0x88;
  pbVar1[2] = 0x62;
  pbVar1[3] = 3;
  pbVar1 = (byte *)((long)local_e0.data + 0x18);
  pbVar1[0] = 0xd2;
  pbVar1[1] = 10;
  pbVar1[2] = 0x6f;
  pbVar1[3] = 0x12;
  pbVar1[4] = 0x21;
  pbVar1[5] = 0x19;
  pbVar1[6] = 0xcc;
  pbVar1[7] = 4;
  pbVar1 = (byte *)((long)local_e0.data + 0x20);
  pbVar1[0] = 0x5f;
  pbVar1[1] = 0x70;
  pbVar1[2] = 9;
  pbVar1[3] = 0xaf;
  pbVar1 = (byte *)((long)local_e0.data + 0x28);
  pbVar1[0] = 0;
  pbVar1[1] = 0;
  pbVar1[2] = 0;
  pbVar1[3] = 0;
  pbVar1[4] = 0;
  pbVar1[5] = 0x90;
  pbVar1[6] = 0x75;
  pbVar1[7] = 0x40;
  local_90._0_8_ = local_e0.segment;
  local_90._8_8_ = local_e0.capTable;
  local_90._16_8_ = local_e0.pointers;
  value_01.super_StringPtr.content.size_ = 4;
  value_01.super_StringPtr.content.ptr = "baz";
  PointerBuilder::setBlob<capnp::Text>((PointerBuilder *)local_90,value_01);
  local_90._16_8_ = local_e0.pointers + 1;
  local_90._0_8_ = local_e0.segment;
  local_90._8_8_ = local_e0.capTable;
  value_02.super_ArrayPtr<const_unsigned_char>.size_ = 3;
  value_02.super_ArrayPtr<const_unsigned_char>.ptr = "qux";
  PointerBuilder::setBlob<capnp::Data>((PointerBuilder *)local_90,value_02);
  local_b8.data = local_e0.pointers + 2;
  local_b8.segment = local_e0.segment;
  local_b8.capTable = local_e0.capTable;
  PointerBuilder::initStruct
            ((StructBuilder *)local_90,(PointerBuilder *)&local_b8,(StructSize)0x140006);
  local_b8.segment = (SegmentBuilder *)local_90._0_8_;
  local_b8.capTable = (CapTableBuilder *)local_90._8_8_;
  local_b8.data = local_78;
  value_03.super_StringPtr.content.size_ = 7;
  value_03.super_StringPtr.content.ptr = "nested";
  PointerBuilder::setBlob<capnp::Text>((PointerBuilder *)&local_b8,value_03);
  local_60.pointer = local_78 + 2;
  local_60.segment = (SegmentBuilder *)local_90._0_8_;
  local_60.capTable = (CapTableBuilder *)local_90._8_8_;
  PointerBuilder::initStruct(&local_b8,&local_60,(StructSize)0x140006);
  local_60.segment = local_b8.segment;
  local_60.capTable = local_b8.capTable;
  local_60.pointer = local_b8.pointers;
  value_04.super_StringPtr.content.size_ = 0xe;
  value_04.super_StringPtr.content.ptr = "really nested";
  PointerBuilder::setBlob<capnp::Text>(&local_60,value_04);
  ((byte *)((long)local_e0.data + 0x24))[0] = 2;
  ((byte *)((long)local_e0.data + 0x24))[1] = 0;
  local_b8.data = local_e0.pointers + 3;
  local_b8.segment = local_e0.segment;
  local_b8.capTable = local_e0.capTable;
  uVar5 = 0;
  PointerBuilder::initList((ListBuilder *)local_90,(PointerBuilder *)&local_b8,VOID,3);
  local_b8.segment = (SegmentBuilder *)CONCAT35(local_b8.segment._5_3_,0x101000100);
  local_90._16_8_ = local_e0.pointers + 4;
  local_90._0_8_ = local_e0.segment;
  local_90._8_8_ = local_e0.capTable;
  builder_00.capTable = local_e0.capTable;
  builder_00.segment = local_e0.segment;
  builder_00.pointer = (WirePointer *)local_90._16_8_;
  value_11.size_ = 5;
  value_11.ptr = (bool *)&local_b8;
  PointerHelpers<capnp::List<bool,_(capnp::Kind)0>,_(capnp::Kind)6>::set(builder_00,value_11);
  local_60.segment = (SegmentBuilder *)CONCAT44(local_60.segment._4_4_,0x7f80de0c);
  local_b8.data = local_e0.pointers + 5;
  local_b8.segment = local_e0.segment;
  local_b8.capTable = local_e0.capTable;
  PointerBuilder::initList((ListBuilder *)local_90,(PointerBuilder *)&local_b8,BYTE,4);
  lVar4 = 0;
  do {
    puVar2 = (undefined1 *)((long)&local_60.segment + lVar4);
    lVar4 = lVar4 + 1;
    *(undefined1 *)((long)&((WireValue<uint32_t>_conflict *)local_90._16_8_)->value + (uVar5 >> 3))
         = *puVar2;
    uVar5 = uVar5 + ((ulong)local_78 >> 0x20);
  } while (lVar4 != 4);
  local_60.segment = (SegmentBuilder *)0x7fff8000e9d204d2;
  local_b8.data = local_e0.pointers + 6;
  local_b8.segment = local_e0.segment;
  local_b8.capTable = local_e0.capTable;
  PointerBuilder::initList((ListBuilder *)local_90,(PointerBuilder *)&local_b8,TWO_BYTES,4);
  uVar5 = 0;
  lVar4 = 0;
  do {
    *(undefined2 *)((long)&((WireValue<uint32_t>_conflict *)local_90._16_8_)->value + (uVar5 >> 3))
         = *(undefined2 *)((long)&local_60.segment + lVar4);
    lVar4 = lVar4 + 2;
    uVar5 = uVar5 + ((ulong)local_78 >> 0x20);
  } while (lVar4 != 8);
  local_60.segment = (SegmentBuilder *)0xfaa0d34000bc614e;
  local_60.capTable = (CapTableBuilder *)0x7fffffff80000000;
  local_b8.data = local_e0.pointers + 7;
  local_b8.segment = local_e0.segment;
  local_b8.capTable = local_e0.capTable;
  PointerBuilder::initList((ListBuilder *)local_90,(PointerBuilder *)&local_b8,FOUR_BYTES,4);
  uVar5 = 0;
  lVar4 = 0;
  do {
    *(undefined4 *)((long)&((WireValue<uint32_t>_conflict *)local_90._16_8_)->value + (uVar5 >> 3))
         = *(undefined4 *)((long)&local_60.segment + lVar4);
    lVar4 = lVar4 + 4;
    uVar5 = uVar5 + ((ulong)local_78 >> 0x20);
  } while (lVar4 != 0x10);
  local_b8.data = local_e0.pointers + 8;
  local_b8.segment = local_e0.segment;
  local_b8.capTable = local_e0.capTable;
  PointerBuilder::initList((ListBuilder *)local_90,(PointerBuilder *)&local_b8,EIGHT_BYTES,4);
  uVar5 = 0;
  lVar4 = 0;
  do {
    *(undefined8 *)((long)&((WireValue<uint32_t>_conflict *)local_90._16_8_)->value + (uVar5 >> 3))
         = *(undefined8 *)((long)&DAT_0054b658 + lVar4);
    lVar4 = lVar4 + 8;
    uVar5 = uVar5 + ((ulong)local_78 >> 0x20);
  } while (lVar4 != 0x20);
  local_60.segment = (SegmentBuilder *)CONCAT44(local_60.segment._4_4_,0xff00220c);
  local_b8.data = local_e0.pointers + 9;
  local_b8.segment = local_e0.segment;
  local_b8.capTable = local_e0.capTable;
  PointerBuilder::initList((ListBuilder *)local_90,(PointerBuilder *)&local_b8,BYTE,4);
  uVar5 = 0;
  lVar4 = 0;
  do {
    puVar2 = (undefined1 *)((long)&local_60.segment + lVar4);
    lVar4 = lVar4 + 1;
    *(undefined1 *)((long)&((WireValue<uint32_t>_conflict *)local_90._16_8_)->value + (uVar5 >> 3))
         = *puVar2;
    uVar5 = uVar5 + ((ulong)local_78 >> 0x20);
  } while (lVar4 != 4);
  local_60.segment = (SegmentBuilder *)0xffff0000162e04d2;
  local_b8.data = local_e0.pointers + 10;
  local_b8.segment = local_e0.segment;
  local_b8.capTable = local_e0.capTable;
  PointerBuilder::initList((ListBuilder *)local_90,(PointerBuilder *)&local_b8,TWO_BYTES,4);
  uVar5 = 0;
  lVar4 = 0;
  do {
    *(undefined2 *)((long)&((WireValue<uint32_t>_conflict *)local_90._16_8_)->value + (uVar5 >> 3))
         = *(undefined2 *)((long)&local_60.segment + lVar4);
    lVar4 = lVar4 + 2;
    uVar5 = uVar5 + ((ulong)local_78 >> 0x20);
  } while (lVar4 != 8);
  local_60.segment = (SegmentBuilder *)0x55f2cc000bc614e;
  local_60.capTable = (CapTableBuilder *)&DAT_ffffffff00000000;
  local_b8.data = local_e0.pointers + 0xb;
  local_b8.segment = local_e0.segment;
  local_b8.capTable = local_e0.capTable;
  PointerBuilder::initList((ListBuilder *)local_90,(PointerBuilder *)&local_b8,FOUR_BYTES,4);
  uVar5 = 0;
  lVar4 = 0;
  do {
    *(undefined4 *)((long)&((WireValue<uint32_t>_conflict *)local_90._16_8_)->value + (uVar5 >> 3))
         = *(undefined4 *)((long)&local_60.segment + lVar4);
    lVar4 = lVar4 + 4;
    uVar5 = uVar5 + ((ulong)local_78 >> 0x20);
  } while (lVar4 != 0x10);
  local_b8.data = local_e0.pointers + 0xc;
  local_b8.segment = local_e0.segment;
  local_b8.capTable = local_e0.capTable;
  PointerBuilder::initList((ListBuilder *)local_90,(PointerBuilder *)&local_b8,EIGHT_BYTES,4);
  uVar5 = 0;
  lVar4 = 0;
  do {
    *(undefined8 *)((long)&((WireValue<uint32_t>_conflict *)local_90._16_8_)->value + (uVar5 >> 3))
         = *(undefined8 *)((long)&DAT_0054b678 + lVar4);
    lVar4 = lVar4 + 8;
    uVar5 = uVar5 + ((ulong)local_78 >> 0x20);
  } while (lVar4 != 0x20);
  local_b8.data = local_e0.pointers + 0xd;
  local_b8.segment = local_e0.segment;
  local_b8.capTable = local_e0.capTable;
  PointerBuilder::initList((ListBuilder *)local_90,(PointerBuilder *)&local_b8,FOUR_BYTES,6);
  uVar5 = 0;
  lVar4 = 0;
  do {
    *(undefined4 *)((long)&((WireValue<uint32_t>_conflict *)local_90._16_8_)->value + (uVar5 >> 3))
         = *(undefined4 *)((long)&DAT_0054ade4 + lVar4);
    lVar4 = lVar4 + 4;
    uVar5 = uVar5 + local_78._4_4_;
  } while (lVar4 != 0x18);
  local_b8.data = local_e0.pointers + 0xe;
  local_b8.segment = local_e0.segment;
  local_b8.capTable = local_e0.capTable;
  PointerBuilder::initList((ListBuilder *)local_90,(PointerBuilder *)&local_b8,EIGHT_BYTES,6);
  uVar5 = 0;
  lVar4 = 0;
  do {
    *(undefined8 *)((long)&((WireValue<uint32_t>_conflict *)local_90._16_8_)->value + (uVar5 >> 3))
         = *(undefined8 *)((long)&DAT_0054ae00 + lVar4);
    lVar4 = lVar4 + 8;
    uVar5 = uVar5 + local_78._4_4_;
  } while (lVar4 != 0x30);
  local_90._0_8_ = "quux";
  local_90._8_8_ = &DAT_00000005;
  local_90._16_8_ = "corge";
  local_78 = (WirePointer *)0x6;
  local_70 = "grault";
  local_68 = 7;
  local_b8.data = local_e0.pointers + 0xf;
  local_b8.segment = local_e0.segment;
  local_b8.capTable = local_e0.capTable;
  builder_01.capTable = local_e0.capTable;
  builder_01.segment = local_e0.segment;
  builder_01.pointer = (WirePointer *)local_b8.data;
  value_12.size_ = 3;
  value_12.ptr = (Reader *)local_90;
  PointerHelpers<capnp::List<capnp::Text,_(capnp::Kind)1>,_(capnp::Kind)6>::set(builder_01,value_12)
  ;
  local_90._0_8_ = "garply";
  local_90._8_8_ = (CapTableBuilder *)0x6;
  local_90._16_8_ = anon_var_dwarf_12ec57;
  local_78 = (WirePointer *)&DAT_00000005;
  local_70 = "fred";
  local_68 = 4;
  local_b8.data = local_e0.pointers + 0x10;
  local_b8.segment = local_e0.segment;
  local_b8.capTable = local_e0.capTable;
  builder_02.capTable = local_e0.capTable;
  builder_02.segment = local_e0.segment;
  builder_02.pointer = (WirePointer *)local_b8.data;
  value_13.size_ = 3;
  value_13.ptr = (Reader *)local_90;
  PointerHelpers<capnp::List<capnp::Data,_(capnp::Kind)1>,_(capnp::Kind)6>::set(builder_02,value_13)
  ;
  local_b8.data = local_e0.pointers + 0x11;
  local_b8.segment = local_e0.segment;
  local_b8.capTable = local_e0.capTable;
  PointerBuilder::initStructList
            ((ListBuilder *)local_90,(PointerBuilder *)&local_b8,3,(StructSize)0x140006);
  uVar5 = 0;
  ListBuilder::getStructElement(&local_b8,(ListBuilder *)local_90,0);
  local_60.segment = local_b8.segment;
  local_60.capTable = local_b8.capTable;
  local_60.pointer = local_b8.pointers;
  value_05.super_StringPtr.content.size_ = 0xf;
  value_05.super_StringPtr.content.ptr = "x structlist 1";
  PointerBuilder::setBlob<capnp::Text>(&local_60,value_05);
  ListBuilder::getStructElement(&local_b8,(ListBuilder *)local_90,1);
  local_60.segment = local_b8.segment;
  local_60.capTable = local_b8.capTable;
  local_60.pointer = local_b8.pointers;
  value_06.super_StringPtr.content.size_ = 0xf;
  value_06.super_StringPtr.content.ptr = "x structlist 2";
  PointerBuilder::setBlob<capnp::Text>(&local_60,value_06);
  ListBuilder::getStructElement(&local_b8,(ListBuilder *)local_90,2);
  local_60.segment = local_b8.segment;
  local_60.capTable = local_b8.capTable;
  local_60.pointer = local_b8.pointers;
  value_07.super_StringPtr.content.size_ = 0xf;
  value_07.super_StringPtr.content.ptr = "x structlist 3";
  PointerBuilder::setBlob<capnp::Text>(&local_60,value_07);
  local_60.segment = (SegmentBuilder *)CONCAT26(local_60.segment._6_2_,0x600010003);
  local_b8.data = local_e0.pointers + 0x12;
  local_b8.segment = local_e0.segment;
  local_b8.capTable = local_e0.capTable;
  PointerBuilder::initList((ListBuilder *)local_90,(PointerBuilder *)&local_b8,TWO_BYTES,3);
  pCVar3 = local_48;
  lVar4 = 0;
  do {
    *(undefined2 *)((long)&((WireValue<uint32_t>_conflict *)local_90._16_8_)->value + (uVar5 >> 3))
         = *(undefined2 *)((long)&local_60.segment + lVar4);
    lVar4 = lVar4 + 2;
    uVar5 = uVar5 + ((ulong)local_78 >> 0x20);
  } while (lVar4 != 6);
  *(undefined2 *)((long)&(local_40->super_SegmentReader).readLimiter + 4) = 0;
  local_e0.data = subBuilder._builder.capTable + 3;
  local_e0.segment = local_38;
  local_e0.capTable = local_48;
  uVar5 = 0;
  PointerBuilder::initList((ListBuilder *)local_90,(PointerBuilder *)&local_e0,VOID,6);
  local_e0.segment = (SegmentBuilder *)CONCAT44(local_e0.segment._4_4_,0x1000001);
  local_90._16_8_ = subBuilder._builder.capTable + 4;
  local_90._0_8_ = local_38;
  local_90._8_8_ = pCVar3;
  builder_03.capTable = pCVar3;
  builder_03.segment = local_38;
  builder_03.pointer = (WirePointer *)local_90._16_8_;
  value_14.size_ = 4;
  value_14.ptr = (bool *)&local_e0;
  PointerHelpers<capnp::List<bool,_(capnp::Kind)0>,_(capnp::Kind)6>::set(builder_03,value_14);
  local_b8.segment = (SegmentBuilder *)CONCAT62(local_b8.segment._2_6_,0x916f);
  local_e0.data = subBuilder._builder.capTable + 5;
  local_e0.segment = local_38;
  local_e0.capTable = pCVar3;
  PointerBuilder::initList((ListBuilder *)local_90,(PointerBuilder *)&local_e0,BYTE,2);
  lVar4 = 0;
  do {
    puVar2 = (undefined1 *)((long)&local_b8.segment + lVar4);
    lVar4 = lVar4 + 1;
    *(undefined1 *)((long)&((WireValue<uint32_t>_conflict *)local_90._16_8_)->value + (uVar5 >> 3))
         = *puVar2;
    uVar5 = uVar5 + ((ulong)local_78 >> 0x20);
  } while (lVar4 != 2);
  local_b8.segment = (SegmentBuilder *)CONCAT44(local_b8.segment._4_4_,0xd4992b67);
  local_e0.data = subBuilder._builder.capTable + 6;
  local_e0.segment = local_38;
  local_e0.capTable = pCVar3;
  PointerBuilder::initList((ListBuilder *)local_90,(PointerBuilder *)&local_e0,TWO_BYTES,2);
  uVar5 = 0;
  lVar4 = 0;
  do {
    *(undefined2 *)((long)&((WireValue<uint32_t>_conflict *)local_90._16_8_)->value + (uVar5 >> 3))
         = *(undefined2 *)((long)&local_b8.segment + lVar4);
    lVar4 = lVar4 + 2;
    uVar5 = uVar5 + ((ulong)local_78 >> 0x20);
  } while (lVar4 != 4);
  local_b8.segment = (SegmentBuilder *)0xf9609439069f6bc7;
  local_e0.data = subBuilder._builder.capTable + 7;
  local_e0.segment = local_38;
  local_e0.capTable = pCVar3;
  PointerBuilder::initList((ListBuilder *)local_90,(PointerBuilder *)&local_e0,FOUR_BYTES,2);
  uVar5 = 0;
  lVar4 = 0;
  do {
    *(undefined4 *)((long)&((WireValue<uint32_t>_conflict *)local_90._16_8_)->value + (uVar5 >> 3))
         = *(undefined4 *)((long)&local_b8.segment + lVar4);
    lVar4 = lVar4 + 4;
    uVar5 = uVar5 + ((ulong)local_78 >> 0x20);
  } while (lVar4 != 8);
  local_b8.segment = (SegmentBuilder *)0xf6b75ab2bc471c7;
  local_b8.capTable = (CapTableBuilder *)0xf0948a54d43b8e39;
  local_e0.data = subBuilder._builder.capTable + 8;
  local_e0.segment = local_38;
  local_e0.capTable = pCVar3;
  PointerBuilder::initList((ListBuilder *)local_90,(PointerBuilder *)&local_e0,EIGHT_BYTES,2);
  uVar5 = 0;
  lVar4 = 0;
  do {
    *(undefined8 *)((long)&((WireValue<uint32_t>_conflict *)local_90._16_8_)->value + (uVar5 >> 3))
         = *(undefined8 *)((long)&local_b8.segment + lVar4);
    lVar4 = lVar4 + 8;
    uVar5 = uVar5 + ((ulong)local_78 >> 0x20);
  } while (lVar4 != 0x10);
  local_b8.segment = (SegmentBuilder *)CONCAT62(local_b8.segment._2_6_,0xde6f);
  local_e0.data = subBuilder._builder.capTable + 9;
  local_e0.segment = local_38;
  local_e0.capTable = pCVar3;
  PointerBuilder::initList((ListBuilder *)local_90,(PointerBuilder *)&local_e0,BYTE,2);
  uVar5 = 0;
  lVar4 = 0;
  do {
    puVar2 = (undefined1 *)((long)&local_b8.segment + lVar4);
    lVar4 = lVar4 + 1;
    *(undefined1 *)((long)&((WireValue<uint32_t>_conflict *)local_90._16_8_)->value + (uVar5 >> 3))
         = *puVar2;
    uVar5 = uVar5 + ((ulong)local_78 >> 0x20);
  } while (lVar4 != 2);
  local_b8.segment = (SegmentBuilder *)CONCAT44(local_b8.segment._4_4_,0xad9c8235);
  local_e0.data = subBuilder._builder.capTable + 10;
  local_e0.segment = local_38;
  local_e0.capTable = pCVar3;
  PointerBuilder::initList((ListBuilder *)local_90,(PointerBuilder *)&local_e0,TWO_BYTES,2);
  uVar5 = 0;
  lVar4 = 0;
  do {
    *(undefined2 *)((long)&((WireValue<uint32_t>_conflict *)local_90._16_8_)->value + (uVar5 >> 3))
         = *(undefined2 *)((long)&local_b8.segment + lVar4);
    lVar4 = lVar4 + 2;
    uVar5 = uVar5 + ((ulong)local_78 >> 0x20);
  } while (lVar4 != 4);
  local_e0.data = subBuilder._builder.capTable + 0xb;
  local_e0.segment = local_38;
  local_e0.capTable = pCVar3;
  PointerBuilder::initList((ListBuilder *)local_90,(PointerBuilder *)&local_e0,FOUR_BYTES,1);
  ((WireValue<uint32_t>_conflict *)local_90._16_8_)->value = 0xc6aea155;
  local_e0.data = subBuilder._builder.capTable + 0xc;
  local_e0.segment = local_38;
  local_e0.capTable = pCVar3;
  PointerBuilder::initList((ListBuilder *)local_90,(PointerBuilder *)&local_e0,EIGHT_BYTES,1);
  *(WirePointer *)local_90._16_8_ = (WirePointer)0x9a3298afb5ac71c7;
  local_b8.segment = (SegmentBuilder *)0x7f80000045ad9c00;
  local_b8.capTable = (CapTableBuilder *)0x7fc00000ff800000;
  local_e0.data = subBuilder._builder.capTable + 0xd;
  local_e0.segment = local_38;
  local_e0.capTable = pCVar3;
  PointerBuilder::initList((ListBuilder *)local_90,(PointerBuilder *)&local_e0,FOUR_BYTES,4);
  uVar5 = 0;
  lVar4 = 0;
  do {
    *(undefined4 *)((long)&((WireValue<uint32_t>_conflict *)local_90._16_8_)->value + (uVar5 >> 3))
         = *(undefined4 *)((long)&local_b8.segment + lVar4);
    lVar4 = lVar4 + 4;
    uVar5 = uVar5 + ((ulong)local_78 >> 0x20);
  } while (lVar4 != 0x10);
  local_e0.data = subBuilder._builder.capTable + 0xe;
  local_e0.segment = local_38;
  local_e0.capTable = pCVar3;
  PointerBuilder::initList((ListBuilder *)local_90,(PointerBuilder *)&local_e0,EIGHT_BYTES,4);
  uVar5 = 0;
  lVar4 = 0;
  do {
    *(undefined8 *)((long)&((WireValue<uint32_t>_conflict *)local_90._16_8_)->value + (uVar5 >> 3))
         = *(undefined8 *)((long)&DAT_0054b638 + lVar4);
    lVar4 = lVar4 + 8;
    uVar5 = uVar5 + ((ulong)local_78 >> 0x20);
  } while (lVar4 != 0x20);
  local_90._0_8_ = "plugh";
  local_90._8_8_ = (CapTableBuilder *)0x6;
  local_90._16_8_ = "xyzzy";
  local_78 = (WirePointer *)0x6;
  local_70 = "thud";
  local_68 = 5;
  local_e0.data = subBuilder._builder.capTable + 0xf;
  local_e0.segment = local_38;
  local_e0.capTable = pCVar3;
  builder_04.capTable = pCVar3;
  builder_04.segment = local_38;
  builder_04.pointer = (WirePointer *)local_e0.data;
  value_15.size_ = 3;
  value_15.ptr = (Reader *)local_90;
  PointerHelpers<capnp::List<capnp::Text,_(capnp::Kind)1>,_(capnp::Kind)6>::set(builder_04,value_15)
  ;
  local_90._0_8_ = "oops";
  local_90._8_8_ = &DAT_00000004;
  local_90._16_8_ = anon_var_dwarf_409faf;
  local_78 = (WirePointer *)&DAT_00000009;
  local_70 = "rfc3092";
  local_68 = 7;
  local_e0.data = subBuilder._builder.capTable + 0x10;
  local_e0.segment = local_38;
  local_e0.capTable = pCVar3;
  builder_05.capTable = pCVar3;
  builder_05.segment = local_38;
  builder_05.pointer = (WirePointer *)local_e0.data;
  value_16.size_ = 3;
  value_16.ptr = (Reader *)local_90;
  PointerHelpers<capnp::List<capnp::Data,_(capnp::Kind)1>,_(capnp::Kind)6>::set(builder_05,value_16)
  ;
  local_e0.data = subBuilder._builder.capTable + 0x11;
  local_e0.segment = local_38;
  local_e0.capTable = pCVar3;
  PointerBuilder::initStructList
            ((ListBuilder *)local_90,(PointerBuilder *)&local_e0,3,(StructSize)0x140006);
  uVar5 = 0;
  ListBuilder::getStructElement(&local_e0,(ListBuilder *)local_90,0);
  local_b8.segment = local_e0.segment;
  local_b8.capTable = local_e0.capTable;
  local_b8.data = local_e0.pointers;
  value_08.super_StringPtr.content.size_ = 0xd;
  value_08.super_StringPtr.content.ptr = "structlist 1";
  PointerBuilder::setBlob<capnp::Text>((PointerBuilder *)&local_b8,value_08);
  ListBuilder::getStructElement(&local_e0,(ListBuilder *)local_90,1);
  local_b8.segment = local_e0.segment;
  local_b8.capTable = local_e0.capTable;
  local_b8.data = local_e0.pointers;
  value_09.super_StringPtr.content.size_ = 0xd;
  value_09.super_StringPtr.content.ptr = "structlist 2";
  PointerBuilder::setBlob<capnp::Text>((PointerBuilder *)&local_b8,value_09);
  ListBuilder::getStructElement(&local_e0,(ListBuilder *)local_90,2);
  local_b8.segment = local_e0.segment;
  local_b8.capTable = local_e0.capTable;
  local_b8.data = local_e0.pointers;
  value_10.super_StringPtr.content.size_ = 0xd;
  value_10.super_StringPtr.content.ptr = "structlist 3";
  PointerBuilder::setBlob<capnp::Text>((PointerBuilder *)&local_b8,value_10);
  local_b8.segment = (SegmentBuilder *)CONCAT44(local_b8.segment._4_4_,0x70000);
  local_e0.data = subBuilder._builder.capTable + 0x12;
  local_e0.segment = local_38;
  local_e0.capTable = local_48;
  PointerBuilder::initList((ListBuilder *)local_90,(PointerBuilder *)&local_e0,TWO_BYTES,2);
  lVar4 = 0;
  do {
    *(undefined2 *)((long)&((WireValue<uint32_t>_conflict *)local_90._16_8_)->value + (uVar5 >> 3))
         = *(undefined2 *)((long)&local_b8.segment + lVar4);
    lVar4 = lVar4 + 2;
    uVar5 = uVar5 + ((ulong)local_78 >> 0x20);
  } while (lVar4 != 4);
  return;
}

Assistant:

void checkTestMessage(TestAllTypes::Builder builder) { genericCheckTestMessage(builder); }